

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void google::protobuf::compiler::cpp::anon_unknown_22::MuteWuninitialized(Printer *p)

{
  io::Printer::Emit(p,0x8e,
                    "\n    #if defined(__llvm__)\n    #pragma clang diagnostic push\n    #pragma clang diagnostic ignored \"-Wuninitialized\"\n    #endif  // __llvm__\n  "
                   );
  return;
}

Assistant:

void MuteWuninitialized(io::Printer* p) {
  p->Emit(R"(
    #if defined(__llvm__)
    #pragma clang diagnostic push
    #pragma clang diagnostic ignored "-Wuninitialized"
    #endif  // __llvm__
  )");
}